

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_write_indent(yaml_emitter_t *emitter)

{
  yaml_break_t yVar1;
  yaml_char_t yVar2;
  int iVar3;
  yaml_char_t *pyVar4;
  int iVar5;
  
  iVar5 = 0;
  if (0 < emitter->indent) {
    iVar5 = emitter->indent;
  }
  if (emitter->indention != 0) {
    iVar3 = emitter->column;
    if ((iVar3 <= iVar5) && ((iVar3 != iVar5 || (iVar3 = iVar5, emitter->whitespace != 0))))
    goto LAB_0010716d;
  }
  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
     (iVar3 = yaml_emitter_flush(emitter), iVar3 == 0)) {
    return 0;
  }
  yVar1 = emitter->line_break;
  if (yVar1 == YAML_CR_BREAK) {
    yVar2 = '\r';
LAB_00107150:
    pyVar4 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar4 + 1;
    *pyVar4 = yVar2;
  }
  else {
    if (yVar1 == YAML_CRLN_BREAK) {
      pyVar4 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar4 + 1;
      *pyVar4 = '\r';
LAB_0010714a:
      yVar2 = '\n';
      goto LAB_00107150;
    }
    if (yVar1 == YAML_LN_BREAK) goto LAB_0010714a;
  }
  emitter->column = 0;
  emitter->line = emitter->line + 1;
  iVar3 = 0;
LAB_0010716d:
  do {
    if (iVar5 <= iVar3) {
      emitter->whitespace = 1;
      emitter->indention = 1;
      return 1;
    }
    pyVar4 = (emitter->buffer).pointer;
    if ((emitter->buffer).end <= pyVar4 + 5) {
      iVar3 = yaml_emitter_flush(emitter);
      if (iVar3 == 0) {
        return 0;
      }
      pyVar4 = (emitter->buffer).pointer;
    }
    (emitter->buffer).pointer = pyVar4 + 1;
    *pyVar4 = ' ';
    iVar3 = emitter->column + 1;
    emitter->column = iVar3;
  } while( true );
}

Assistant:

static int
yaml_emitter_write_indent(yaml_emitter_t *emitter)
{
    int indent = (emitter->indent >= 0) ? emitter->indent : 0;

    if (!emitter->indention || emitter->column > indent
            || (emitter->column == indent && !emitter->whitespace)) {
        if (!PUT_BREAK(emitter)) return 0;
    }

    while (emitter->column < indent) {
        if (!PUT(emitter, ' ')) return 0;
    }

    emitter->whitespace = 1;
    emitter->indention = 1;

    return 1;
}